

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

bool btGeneric6DofSpring2Constraint::matrixToEulerZXY(btMatrix3x3 *mat,btVector3 *xyz)

{
  bool bVar1;
  float fVar2;
  btScalar bVar3;
  float fVar4;
  
  fVar2 = mat->m_el[1].m_floats[2];
  if (1.0 <= fVar2) {
    xyz->m_floats[0] = 1.5707964;
    xyz->m_floats[1] = 0.0;
    bVar3 = atan2f(mat->m_el[2].m_floats[0],mat->m_el[0].m_floats[0]);
  }
  else {
    if (-1.0 < fVar2) {
      fVar4 = -1.0;
      if (-1.0 <= fVar2) {
        fVar4 = fVar2;
      }
      fVar2 = 1.0;
      if (fVar4 <= 1.0) {
        fVar2 = fVar4;
      }
      fVar2 = asinf(fVar2);
      xyz->m_floats[0] = fVar2;
      fVar2 = atan2f(-mat->m_el[0].m_floats[2],mat->m_el[2].m_floats[2]);
      xyz->m_floats[1] = fVar2;
      bVar3 = atan2f(-mat->m_el[1].m_floats[0],mat->m_el[1].m_floats[1]);
      bVar1 = true;
      goto LAB_0019744a;
    }
    xyz->m_floats[0] = -1.5707964;
    xyz->m_floats[1] = 0.0;
    fVar2 = atan2f(mat->m_el[2].m_floats[0],mat->m_el[0].m_floats[0]);
    bVar3 = -fVar2;
  }
  bVar1 = false;
LAB_0019744a:
  xyz->m_floats[2] = bVar3;
  return bVar1;
}

Assistant:

bool btGeneric6DofSpring2Constraint::matrixToEulerZXY(const btMatrix3x3& mat,btVector3& xyz)
{
	// rot =  cz*cy-sz*sx*sy    -cx*sz   cz*sy+cy*sz*sx
	//        cy*sz+cz*sx*sy     cz*cx   sz*sy-cz*xy*sx
	//        -cx*sy              sx     cx*cy

	btScalar fi = btGetMatrixElem(mat,7);
	if (fi < btScalar(1.0f))
	{
		if (fi > btScalar(-1.0f))
		{
			xyz[0] = btAsin(btGetMatrixElem(mat,7));
			xyz[1] = btAtan2(-btGetMatrixElem(mat,6),btGetMatrixElem(mat,8));
			xyz[2] = btAtan2(-btGetMatrixElem(mat,1),btGetMatrixElem(mat,4));
			return true;
		}
		else
		{
			xyz[0] = -SIMD_HALF_PI;
			xyz[1] = btScalar(0.0);
			xyz[2] = -btAtan2(btGetMatrixElem(mat,2),btGetMatrixElem(mat,0));
			return false;
		}
	}
	else
	{
		xyz[0] = SIMD_HALF_PI;
		xyz[1] = btScalar(0.0);
		xyz[2] = btAtan2(btGetMatrixElem(mat,2),btGetMatrixElem(mat,0));
	}
	return false;
}